

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::addDefaultGlobalOptimizationPrePasses(PassRunner *this)

{
  bool bVar1;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"duplicate-function-elimination",&local_11);
  addIfNoDWARFIssues(this,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (1 < (this->options).optimizeLevel) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"remove-unused-module-elements",&local_11);
    addIfNoDWARFIssues(this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"memory-packing",&local_11);
  addIfNoDWARFIssues(this,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  if ((this->options).optimizeLevel < 2) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"once-reduction",&local_11);
    addIfNoDWARFIssues(this,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    bVar1 = 1 < (this->options).optimizeLevel;
  }
  if ((((this->wasm->features).features & 0x400) != 0) && (bVar1)) {
    if ((this->options).closedWorld == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"type-refining",&local_11);
      addIfNoDWARFIssues(this,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"signature-pruning",&local_11);
      addIfNoDWARFIssues(this,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"signature-refining",&local_11);
      addIfNoDWARFIssues(this,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"global-refining",&local_11);
    addIfNoDWARFIssues(this,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    if ((this->options).closedWorld == true) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"gto",&local_11);
      addIfNoDWARFIssues(this,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"remove-unused-module-elements",&local_11);
    addIfNoDWARFIssues(this,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((this->options).closedWorld == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"remove-unused-types",&local_11);
      addIfNoDWARFIssues(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"cfp",&local_11);
      addIfNoDWARFIssues(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"gsi",&local_11);
      addIfNoDWARFIssues(this,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"abstract-type-refining",&local_11);
      addIfNoDWARFIssues(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void PassRunner::addDefaultGlobalOptimizationPrePasses() {
  // Removing duplicate functions is fast and saves work later.
  addIfNoDWARFIssues("duplicate-function-elimination");
  // Do a global cleanup before anything heavy, as it is fairly fast and can
  // save a lot of work if there is a significant amount of dead code.
  if (options.optimizeLevel >= 2) {
    addIfNoDWARFIssues("remove-unused-module-elements");
  }
  addIfNoDWARFIssues("memory-packing");
  if (options.optimizeLevel >= 2) {
    addIfNoDWARFIssues("once-reduction");
  }
  if (wasm->features.hasGC() && options.optimizeLevel >= 2) {
    if (options.closedWorld) {
      addIfNoDWARFIssues("type-refining");
      addIfNoDWARFIssues("signature-pruning");
      addIfNoDWARFIssues("signature-refining");
    }
    addIfNoDWARFIssues("global-refining");
    // Global type optimization can remove fields that are not needed, which can
    // remove ref.funcs that were once assigned to vtables but are no longer
    // needed, which can allow more code to be removed globally. After those,
    // constant field propagation can be more effective.
    if (options.closedWorld) {
      addIfNoDWARFIssues("gto");
    }
    addIfNoDWARFIssues("remove-unused-module-elements");
    if (options.closedWorld) {
      addIfNoDWARFIssues("remove-unused-types");
      addIfNoDWARFIssues("cfp");
      addIfNoDWARFIssues("gsi");
      addIfNoDWARFIssues("abstract-type-refining");
    }
  }
  // TODO: generate-global-effects here, right before function passes, then
  //       discard in addDefaultGlobalOptimizationPostPasses? the benefit seems
  //       quite minor so far, except perhaps when using call.without.effects
  //       which can lead to more opportunities for global effects to matter.
}